

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O3

bigint<13> * __thiscall bigint<13>::rshift<13>(bigint<13> *this,bigint<13> *x,int n)

{
  int iVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  ushort uVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  ushort uVar12;
  
  iVar1 = this->len;
  lVar9 = (long)iVar1;
  if (n != 0 && lVar9 != 0) {
    uVar10 = n + 0xe;
    if (-1 < (int)(n - 1U)) {
      uVar10 = n - 1U;
    }
    uVar8 = (int)uVar10 >> 4;
    iVar4 = n - (uVar10 & 0xfffffff0);
    bVar2 = (byte)iVar4;
    uVar10 = ~uVar8 + iVar1;
    uVar6 = x->digits[(int)uVar8] >> (bVar2 & 0x1f);
    if (0 < (int)uVar10) {
      uVar11 = 0;
      do {
        uVar12 = x->digits[(int)(uVar8 + 1 + (int)uVar11)] << (0xf - (bVar2 - 1) & 0x1f) | uVar6;
        uVar6 = x->digits[(int)(uVar8 + 1 + (int)uVar11)] >> (bVar2 & 0x1f);
        this->digits[uVar11] = uVar12;
        uVar11 = uVar11 + 1;
      } while (uVar10 != uVar11);
    }
    this->digits[(int)uVar10] = uVar6;
    iVar4 = iVar4 >> 0x10;
    uVar10 = uVar8 + iVar4;
    iVar3 = iVar1 - uVar10;
    this->len = iVar3;
    if (iVar3 != 0) {
      lVar5 = (long)iVar4 + (long)(int)uVar8;
      lVar7 = 0;
      do {
        if (*(short *)((long)this + lVar7 * 2 + lVar9 * 2 + lVar5 * -2 + 2) != 0) {
          return this;
        }
        this->len = ~uVar10 + iVar1 + (int)lVar7;
        lVar7 = lVar7 + -1;
      } while (lVar5 - lVar9 != lVar7);
    }
  }
  return this;
}

Assistant:

bigint &rshift(const bigint<X_DIGITS> &x, int n)
    {
        if(!len || !n) return *this;
        int dig = (n-1)/BI_DIGIT_BITS;
        n = ((n-1) % BI_DIGIT_BITS)+1;
        digit carry = digit(x.digits[dig]>>n);
        loopi(len-dig-1)
        {
            digit tmp = x.digits[i+dig+1];
            digits[i] = digit((tmp<<(BI_DIGIT_BITS-n)) | carry);
            carry = digit(tmp>>n);
        }
        digits[len-dig-1] = carry;
        len -= dig + (n>>BI_DIGIT_BITS);
        shrink();
        return *this;
    }